

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void __thiscall
fmt::v11::detail::buffer<wchar_t>::append<wchar_t>
          (buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  size_t sVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (begin != end) {
    do {
      uVar4 = (long)end - (long)begin >> 2;
      uVar3 = this->size_ + uVar4;
      if (this->capacity_ < uVar3) {
        (*this->grow_)(this,uVar3);
      }
      sVar1 = this->size_;
      uVar3 = this->capacity_ - sVar1;
      if (uVar4 <= uVar3) {
        uVar3 = uVar4;
      }
      if (uVar3 != 0) {
        pwVar2 = this->ptr_;
        uVar4 = 0;
        do {
          pwVar2[sVar1 + uVar4] = begin[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      this->size_ = sVar1 + uVar3;
      begin = begin + uVar3;
    } while (begin != end);
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }